

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O1

void * trico_open_archive_for_reading(uint8_t *data,uint64_t data_size)

{
  int iVar1;
  trico_archive *arch;
  
  arch = (trico_archive *)malloc(0x48);
  arch->data = (uint8_t *)0x0;
  arch->data_pointer = (uint8_t *)0x0;
  arch->data_size = 0;
  arch->size_available = 0;
  arch->buffer = (uint8_t *)0x0;
  arch->buffer_pointer = (uint8_t *)0x0;
  arch->version = 0;
  arch->next_stream_type = trico_empty;
  arch->buffer_size = 0;
  arch->writable = 0;
  arch->data = data;
  arch->data_pointer = data;
  arch->data_size = data_size;
  if (3 < data_size) {
    iVar1 = *(int *)data;
    arch->data_pointer = data + 4;
    if ((7 < data_size) && (iVar1 == 0x6f637254)) {
      arch->version = *(uint32_t *)(data + 4);
      arch->data_pointer = data + 8;
      read_next_stream_type(arch);
      return arch;
    }
  }
  free(arch);
  return (void *)0x0;
}

Assistant:

void* trico_open_archive_for_reading(const uint8_t* data, uint64_t data_size)
  {
  struct trico_archive* arch = (struct trico_archive*)trico_malloc(sizeof(struct trico_archive));
  arch->buffer = NULL;
  arch->buffer_pointer = NULL;
  arch->data = NULL;
  arch->data_pointer = NULL;
  arch->version = 0;
  arch->next_stream_type = trico_empty;
  arch->buffer_size = 0;
  arch->data_size = 0;
  arch->size_available = 0;
  arch->writable = 0;

  arch->data = data;
  arch->data_pointer = arch->data;
  arch->data_size = data_size;
  if (!read_header(arch))
    {
    trico_free(arch);
    return NULL;
    }
  return arch;
  }